

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

Curl_handler * Curl_builtin_scheme(char *scheme,size_t schemelen)

{
  int iVar1;
  Curl_handler **ppCVar2;
  Curl_handler *pCVar3;
  
  if (schemelen == 0xffffffffffffffff) {
    schemelen = strlen(scheme);
  }
  pCVar3 = &Curl_handler_https;
  ppCVar2 = protocols;
  while ((ppCVar2 = ppCVar2 + 1, iVar1 = Curl_strncasecompare(pCVar3->scheme,scheme,schemelen),
         iVar1 == 0 || (pCVar3->scheme[schemelen] != '\0'))) {
    pCVar3 = *ppCVar2;
    if (pCVar3 == (Curl_handler *)0x0) {
      return (Curl_handler *)0x0;
    }
  }
  return pCVar3;
}

Assistant:

const struct Curl_handler *Curl_builtin_scheme(const char *scheme,
                                               size_t schemelen)
{
  const struct Curl_handler * const *pp;
  const struct Curl_handler *p;
  /* Scan protocol handler table and match against 'scheme'. The handler may
     be changed later when the protocol specific setup function is called. */
  if(schemelen == CURL_ZERO_TERMINATED)
    schemelen = strlen(scheme);
  for(pp = protocols; (p = *pp) != NULL; pp++)
    if(strncasecompare(p->scheme, scheme, schemelen) && !p->scheme[schemelen])
      /* Protocol found in table. */
      return p;
  return NULL; /* not found */
}